

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontAtlas::ClearFonts(ImFontAtlas *this)

{
  byte *in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  if ((*in_RDI & 1) != 0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x6fd,"ClearFonts","ImGui ASSERT FAILED: %s",
                "!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
               );
  }
  for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x40); iVar1 = iVar1 + 1) {
    ImVector<ImFont_*>::operator[]
              ((ImVector<ImFont_*> *)CONCAT44(iVar1,in_stack_fffffffffffffff0),
               (int)((ulong)in_RDI >> 0x20));
    IM_DELETE<ImFont>((ImFont *)0x295023);
  }
  ImVector<ImFont_*>::clear((ImVector<ImFont_*> *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void    ImFontAtlas::ClearFonts()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (int i = 0; i < Fonts.Size; i++)
        IM_DELETE(Fonts[i]);
    Fonts.clear();
}